

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.h
# Opt level: O0

void UnitTest::_UnitTest_Compare::print(char *str)

{
  char *pcVar1;
  ostream *poVar2;
  char *__ptr;
  char *pcVar3;
  char *left;
  char *pos;
  char *str_local;
  
  pcVar1 = strchr(str,10);
  if (pcVar1 == (char *)0x0) {
    std::operator<<((ostream *)&std::cout,str);
  }
  else if (pcVar1 == str) {
    poVar2 = std::operator<<((ostream *)&std::cout,'\n');
    pcVar1 = _unittest_fail();
    std::operator<<(poVar2,pcVar1);
    if ((global_unit_test_object_[0x20] & 1) == 0) {
      std::operator<<((ostream *)&std::cout,anon_var_dwarf_2745);
    }
    print(str + 1);
  }
  else {
    __ptr = strdup(str);
    __ptr[(long)pcVar1 - (long)str] = '\0';
    poVar2 = std::operator<<((ostream *)&std::cout,__ptr);
    poVar2 = std::operator<<(poVar2,'\n');
    pcVar3 = _unittest_fail();
    std::operator<<(poVar2,pcVar3);
    if ((global_unit_test_object_[0x20] & 1) == 0) {
      std::operator<<((ostream *)&std::cout,anon_var_dwarf_2745);
    }
    free(__ptr);
    print(pcVar1 + 1);
  }
  return;
}

Assistant:

static void print(const char *str) {
    const char *pos = 0;
    if (0 != (pos = std::strchr(str, '\n'))) {
      if (pos == str) {
        std::cout << '\n' << _unittest_fail();
        if (!global_unit_test_object_.vim_lines) {
          std::cout << "│ ";
        }
        print(&str[1]);
      } else {
        char *left = strdup(str);
        left[pos - str] = '\0';
        std::cout << left << '\n' << _unittest_fail();
        if (!global_unit_test_object_.vim_lines) {
          std::cout << "│ ";
        }
        free(left);
        print(&pos[1]);
      }
    } else {
      std::cout << str;
    }
  }